

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiDockContext::ImGuiDockContext(ImGuiDockContext *this)

{
  ImGuiDockContext *this_local;
  
  ImGuiStorage::ImGuiStorage(&this->Nodes);
  ImVector<ImGuiDockRequest>::ImVector(&this->Requests);
  ImVector<ImGuiDockNodeSettings>::ImVector(&this->NodesSettings);
  this->WantFullRebuild = false;
  return;
}

Assistant:

ImGuiDockContext()              { WantFullRebuild = false; }